

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O3

void __thiscall JAMA::Eigenvalue<double>::orthes(Eigenvalue<double> *this)

{
  uint uVar1;
  double **ppdVar2;
  double *pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  double **ppdVar6;
  long lVar7;
  bool bVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  double **ppdVar19;
  pointer pdVar20;
  ulong uVar21;
  pointer pdVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  double dVar32;
  
  uVar1 = this->n;
  uVar25 = (ulong)(int)uVar1;
  uVar17 = uVar1 - 1;
  uVar12 = uVar1;
  if (2 < (long)uVar25) {
    uVar18 = uVar25 - 1;
    uVar24 = 1;
    lVar23 = 0;
    uVar13 = (ulong)uVar1;
    uVar16 = uVar25;
    do {
      if (uVar24 < uVar25) {
        dVar30 = 0.0;
        uVar14 = 1;
        do {
          dVar30 = dVar30 + ABS(*(double *)
                                 (*(long *)((long)(this->H).data_ + uVar14 * 8 + lVar23) + -8 +
                                 uVar24 * 8));
          uVar14 = uVar14 + 1;
        } while (uVar16 != uVar14);
        if ((dVar30 != 0.0) || (NAN(dVar30))) {
          dVar32 = 0.0;
          dVar26 = 0.0;
          if (uVar24 < uVar25) {
            ppdVar2 = (this->H).data_;
            pdVar22 = (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar13 = uVar18;
            do {
              dVar26 = ppdVar2[uVar13 & 0xffffffff][uVar24 - 1] / dVar30;
              pdVar22[uVar13] = dVar26;
              dVar32 = dVar32 + dVar26 * dVar26;
              bVar8 = (long)uVar24 < (long)uVar13;
              uVar13 = uVar13 - 1;
              dVar26 = dVar32;
            } while (bVar8);
          }
          if (dVar26 < 0.0) {
            dVar32 = sqrt(dVar26);
          }
          else {
            dVar32 = SQRT(dVar26);
          }
          pdVar22 = (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          dVar27 = pdVar22[uVar24];
          dVar32 = (double)(~-(ulong)(0.0 < dVar27) & (ulong)dVar32 |
                           (ulong)-dVar32 & -(ulong)(0.0 < dVar27));
          dVar26 = dVar26 - dVar27 * dVar32;
          pdVar22[uVar24] = dVar27 - dVar32;
          uVar12 = this->n;
          uVar13 = (ulong)(int)uVar12;
          if ((long)uVar24 < (long)uVar13) {
            ppdVar2 = (this->H).data_;
            uVar14 = uVar24;
            do {
              if (uVar24 < uVar25) {
                dVar27 = 0.0;
                uVar21 = uVar18;
                do {
                  dVar27 = dVar27 + pdVar22[uVar21] * ppdVar2[uVar21 & 0xffffffff][uVar14];
                  bVar8 = (long)uVar24 < (long)uVar21;
                  uVar21 = uVar21 - 1;
                } while (bVar8);
                if (uVar24 < uVar25) {
                  uVar21 = 1;
                  do {
                    lVar15 = *(long *)((long)ppdVar2 + uVar21 * 8 + lVar23);
                    *(double *)(lVar15 + uVar14 * 8) =
                         *(double *)((long)pdVar22 + uVar21 * 8 + lVar23) * (-dVar27 / dVar26) +
                         *(double *)(lVar15 + uVar14 * 8);
                    uVar21 = uVar21 + 1;
                  } while (uVar16 != uVar21);
                }
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar12);
          }
          ppdVar2 = (this->H).data_;
          uVar14 = 0;
          do {
            if (uVar24 < uVar25) {
              dVar27 = 0.0;
              uVar21 = uVar18;
              do {
                dVar27 = dVar27 + pdVar22[uVar21] * ppdVar2[uVar14][uVar21 & 0xffffffff];
                bVar8 = (long)uVar24 < (long)uVar21;
                uVar21 = uVar21 - 1;
              } while (bVar8);
              if (uVar24 < uVar25) {
                pdVar3 = ppdVar2[uVar14];
                uVar21 = 1;
                do {
                  *(double *)((long)pdVar3 + uVar21 * 8 + lVar23) =
                       *(double *)((long)pdVar22 + uVar21 * 8 + lVar23) * (-dVar27 / dVar26) +
                       *(double *)((long)pdVar3 + uVar21 * 8 + lVar23);
                  uVar21 = uVar21 + 1;
                } while (uVar16 != uVar21);
              }
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar25);
          pdVar22[uVar24] = pdVar22[uVar24] * dVar30;
          (this->H).data_[uVar24][uVar24 - 1] = dVar32 * dVar30;
        }
      }
      uVar12 = (uint)uVar13;
      uVar24 = uVar24 + 1;
      lVar23 = lVar23 + 8;
      uVar16 = uVar16 - 1;
    } while (uVar24 != uVar17);
  }
  auVar11 = _DAT_002932a0;
  auVar10 = _DAT_00293290;
  if (0 < (int)uVar12) {
    ppdVar2 = (this->V).data_;
    lVar23 = (ulong)uVar12 - 1;
    auVar28._8_4_ = (int)lVar23;
    auVar28._0_8_ = lVar23;
    auVar28._12_4_ = (int)((ulong)lVar23 >> 0x20);
    uVar18 = 0;
    auVar28 = auVar28 ^ _DAT_002932a0;
    do {
      pdVar3 = ppdVar2[uVar18];
      uVar16 = 0;
      auVar29 = auVar10;
      do {
        auVar31 = auVar29 ^ auVar11;
        if ((bool)(~(auVar31._4_4_ == auVar28._4_4_ && auVar28._0_4_ < auVar31._0_4_ ||
                    auVar28._4_4_ < auVar31._4_4_) & 1)) {
          dVar30 = 1.0;
          if (uVar18 != uVar16) {
            dVar30 = 0.0;
          }
          pdVar3[uVar16] = dVar30;
        }
        if ((auVar31._12_4_ != auVar28._12_4_ || auVar31._8_4_ <= auVar28._8_4_) &&
            auVar31._12_4_ <= auVar28._12_4_) {
          dVar30 = 1.0;
          if (uVar18 - 1 != uVar16) {
            dVar30 = 0.0;
          }
          pdVar3[uVar16 + 1] = dVar30;
        }
        uVar16 = uVar16 + 2;
        lVar23 = auVar29._8_8_;
        auVar29._0_8_ = auVar29._0_8_ + 2;
        auVar29._8_8_ = lVar23 + 2;
      } while ((uVar12 + 1 & 0xfffffffe) != uVar16);
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar12);
  }
  if (2 < (int)uVar1) {
    ppdVar2 = (this->H).data_;
    pdVar4 = (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar18 = (ulong)(uVar1 - 2);
    lVar23 = uVar18 * 8;
    ppdVar19 = ppdVar2 + uVar18 + 1;
    pdVar20 = pdVar4 + uVar18 + 1;
    pdVar22 = pdVar4 + uVar18;
    do {
      uVar16 = uVar18 - 1;
      pdVar3 = ppdVar2[uVar18];
      dVar30 = pdVar3[uVar18 - 1];
      if ((dVar30 != 0.0) || (NAN(dVar30))) {
        iVar9 = (int)uVar18;
        if ((long)uVar18 < (long)(ulong)uVar17) {
          lVar15 = 0;
          do {
            pdVar20[lVar15] = ppdVar19[lVar15][uVar16];
            lVar15 = lVar15 + 1;
          } while (iVar9 + (int)lVar15 < (int)uVar17);
        }
        if ((long)uVar18 < (long)uVar25) {
          pdVar5 = (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          ppdVar6 = (this->V).data_;
          uVar13 = uVar18;
          do {
            dVar30 = 0.0;
            lVar15 = 0;
            do {
              dVar30 = dVar30 + *(double *)((long)pdVar5 + lVar15 * 8 + lVar23) *
                                *(double *)
                                 (*(long *)((long)ppdVar6 + lVar15 * 8 + lVar23) + uVar13 * 8);
              lVar15 = lVar15 + 1;
            } while (iVar9 + (int)lVar15 < (int)uVar1);
            dVar26 = pdVar4[uVar18];
            dVar32 = pdVar3[uVar16];
            lVar15 = 0;
            do {
              lVar7 = *(long *)((long)ppdVar6 + lVar15 * 8 + lVar23);
              *(double *)(lVar7 + uVar13 * 8) =
                   pdVar22[lVar15] * ((dVar30 / dVar26) / dVar32) + *(double *)(lVar7 + uVar13 * 8);
              lVar15 = lVar15 + 1;
            } while (iVar9 + (int)lVar15 < (int)uVar1);
            uVar13 = uVar13 + 1;
          } while ((int)uVar13 < (int)uVar1);
        }
      }
      ppdVar19 = ppdVar19 + -1;
      pdVar20 = pdVar20 + -1;
      lVar23 = lVar23 + -8;
      pdVar22 = pdVar22 + -1;
      bVar8 = 1 < (long)uVar18;
      uVar18 = uVar16;
    } while (bVar8);
  }
  return;
}

Assistant:

void orthes() {
      //  This is derived from the Algol procedures orthes and ortran,
      //  by Martin and Wilkinson, Handbook for Auto. Comp.,
      //  Vol.ii-Linear Algebra, and the corresponding
      //  Fortran subroutines in EISPACK.

      int low  = 0;
      int high = n - 1;

      for (int m = low + 1; m <= high - 1; m++) {
        // Scale column.

        Real scale = 0.0;
        for (int i = m; i <= high; i++) {
          scale = scale + abs(H(i, m - 1));
        }
        if (scale != 0.0) {
          // Compute Householder transformation.

          Real h = 0.0;
          for (int i = high; i >= m; i--) {
            ort(i) = H(i, m - 1) / scale;
            h += ort(i) * ort(i);
          }
          Real g = sqrt(h);
          if (ort(m) > 0) { g = -g; }
          h      = h - ort(m) * g;
          ort(m) = ort(m) - g;

          // Apply Householder similarity transformation
          // H = (I-u*u'/h)*H*(I-u*u')/h)

          for (int j = m; j < n; j++) {
            Real f = 0.0;
            for (int i = high; i >= m; i--) {
              f += ort(i) * H(i, j);
            }
            f = f / h;
            for (int i = m; i <= high; i++) {
              H(i, j) -= f * ort(i);
            }
          }

          for (int i = 0; i <= high; i++) {
            Real f = 0.0;
            for (int j = high; j >= m; j--) {
              f += ort(j) * H(i, j);
            }
            f = f / h;
            for (int j = m; j <= high; j++) {
              H(i, j) -= f * ort(j);
            }
          }
          ort(m)      = scale * ort(m);
          H(m, m - 1) = scale * g;
        }
      }

      // Accumulate transformations (Algol's ortran).

      for (int i = 0; i < n; i++) {
        for (int j = 0; j < n; j++) {
          V(i, j) = (i == j ? 1.0 : 0.0);
        }
      }

      for (int m = high - 1; m >= low + 1; m--) {
        if (H(m, m - 1) != 0.0) {
          for (int i = m + 1; i <= high; i++) {
            ort(i) = H(i, m - 1);
          }
          for (int j = m; j <= high; j++) {
            Real g = 0.0;
            for (int i = m; i <= high; i++) {
              g += ort(i) * V(i, j);
            }
            // Double division avoids possible underflow
            g = (g / ort(m)) / H(m, m - 1);
            for (int i = m; i <= high; i++) {
              V(i, j) += g * ort(i);
            }
          }
        }
      }
    }